

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter.cpp
# Opt level: O2

bool __thiscall
BamTools::BamAlignmentChecker::checkAlignmentTag
          (BamAlignmentChecker *this,PropertyFilterValue *valueFilter,BamAlignment *al)

{
  bool bVar1;
  Impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pIVar2;
  ValueCompareType compareType;
  int8_t asciiQueryValue;
  int8_t asciiFilterValue;
  char tagType;
  Variant local_e8;
  PropertyFilterValue tagFilter;
  Variant entireTagFilter;
  float realQueryValue;
  float realFilterValue;
  uint32_t uintQueryValue;
  uint32_t uintFilterValue;
  int32_t intQueryValue;
  int32_t intFilterValue;
  string local_b0;
  string tagFilterString;
  string stringQueryValue;
  string stringFilterValue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  entireTagFilter.data = (valueFilter->Value).data;
  if (entireTagFilter.data != (ImplBase *)0x0) {
    (entireTagFilter.data)->refs = (entireTagFilter.data)->refs + 1;
  }
  bVar1 = Variant::is_type<std::__cxx11::string>(&entireTagFilter);
  if ((!bVar1) ||
     (pIVar2 = Variant::CastFromBase<std::__cxx11::string>(entireTagFilter.data),
     (pIVar2->data)._M_string_length < 4)) {
    bVar1 = false;
    goto LAB_0017119b;
  }
  std::__cxx11::string::substr((ulong)&local_b0,(ulong)&pIVar2->data);
  tagType = '\0';
  bVar1 = BamAlignment::GetTagType(al,&local_b0,&tagType);
  if (bVar1) {
    std::__cxx11::string::substr((ulong)&tagFilterString,(ulong)&pIVar2->data);
    stringFilterValue._M_dataplus._M_p = (pointer)&stringFilterValue.field_2;
    stringFilterValue._M_string_length = 0;
    bVar1 = false;
    stringFilterValue.field_2._M_local_buf[0] = '\0';
    stringQueryValue._M_dataplus._M_p = (pointer)&stringQueryValue.field_2;
    stringQueryValue._M_string_length = 0;
    stringQueryValue.field_2._M_local_buf[0] = '\0';
    local_e8.data = (ImplBase *)0x0;
    tagFilter.Value.data = (ImplBase *)0x0;
    tagFilter.Type = EXACT;
    Variant::~Variant(&local_e8);
    switch(tagType) {
    case 'A':
      bVar1 = BamAlignment::GetTag<signed_char>(al,&local_b0,&asciiQueryValue);
      if ((bVar1) &&
         (bVar1 = FilterEngine<BamTools::BamAlignmentChecker>::parseToken<signed_char>
                            (&tagFilterString,&asciiFilterValue,&compareType), bVar1)) {
        Variant::Variant<signed_char>(&local_e8,asciiFilterValue);
        Variant::operator=(&tagFilter.Value,&local_e8);
        Variant::~Variant(&local_e8);
        tagFilter.Type = compareType;
        bVar1 = PropertyFilterValue::check<signed_char>(&tagFilter,&asciiQueryValue);
      }
      else {
LAB_00171161:
        bVar1 = false;
      }
      break;
    case 'B':
    case 'D':
    case 'E':
    case 'F':
    case 'G':
      break;
    case 'C':
    case 'I':
switchD_00170f51_caseD_43:
      bVar1 = BamAlignment::GetTag<unsigned_int>(al,&local_b0,&uintQueryValue);
      if ((!bVar1) ||
         (bVar1 = FilterEngine<BamTools::BamAlignmentChecker>::parseToken<unsigned_int>
                            (&tagFilterString,&uintFilterValue,&compareType), !bVar1))
      goto LAB_00171161;
      Variant::Variant<unsigned_int>(&local_e8,uintFilterValue);
      Variant::operator=(&tagFilter.Value,&local_e8);
      Variant::~Variant(&local_e8);
      tagFilter.Type = compareType;
      bVar1 = PropertyFilterValue::check<unsigned_int>(&tagFilter,&uintQueryValue);
      break;
    case 'H':
switchD_00170f51_caseD_48:
      bVar1 = BamAlignment::GetTag<std::__cxx11::string>(al,&local_b0,&stringQueryValue);
      if ((!bVar1) ||
         (bVar1 = FilterEngine<BamTools::BamAlignmentChecker>::parseToken<std::__cxx11::string>
                            (&tagFilterString,&stringFilterValue,&compareType), !bVar1))
      goto LAB_00171161;
      std::__cxx11::string::string((string *)&local_30,(string *)&stringFilterValue);
      Variant::Variant<std::__cxx11::string>(&local_e8,&local_30);
      Variant::operator=(&tagFilter.Value,&local_e8);
      Variant::~Variant(&local_e8);
      std::__cxx11::string::~string((string *)&local_30);
      tagFilter.Type = compareType;
      bVar1 = PropertyFilterValue::check(&tagFilter,&stringQueryValue);
      break;
    default:
      if (tagType == 'S') goto switchD_00170f51_caseD_43;
      if (tagType == 'Z') goto switchD_00170f51_caseD_48;
      if (tagType == 'c') {
LAB_00170ec2:
        bVar1 = BamAlignment::GetTag<int>(al,&local_b0,&intQueryValue);
        if ((!bVar1) ||
           (bVar1 = FilterEngine<BamTools::BamAlignmentChecker>::parseToken<int>
                              (&tagFilterString,&intFilterValue,&compareType), !bVar1))
        goto LAB_00171161;
        Variant::Variant<int>(&local_e8,intFilterValue);
        Variant::operator=(&tagFilter.Value,&local_e8);
        Variant::~Variant(&local_e8);
        tagFilter.Type = compareType;
        bVar1 = PropertyFilterValue::check<int>(&tagFilter,&intQueryValue);
      }
      else if (tagType == 'f') {
        bVar1 = BamAlignment::GetTag<float>(al,&local_b0,&realQueryValue);
        if ((!bVar1) ||
           (bVar1 = FilterEngine<BamTools::BamAlignmentChecker>::parseToken<float>
                              (&tagFilterString,&realFilterValue,&compareType), !bVar1))
        goto LAB_00171161;
        Variant::Variant<float>(&local_e8,realFilterValue);
        Variant::operator=(&tagFilter.Value,&local_e8);
        Variant::~Variant(&local_e8);
        tagFilter.Type = compareType;
        bVar1 = PropertyFilterValue::check<float>(&tagFilter,&realQueryValue);
      }
      else if ((tagType == 'i') || (bVar1 = false, tagType == 's')) goto LAB_00170ec2;
    }
    Variant::~Variant(&tagFilter.Value);
    std::__cxx11::string::~string((string *)&stringQueryValue);
    std::__cxx11::string::~string((string *)&stringFilterValue);
    std::__cxx11::string::~string((string *)&tagFilterString);
  }
  else {
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&local_b0);
LAB_0017119b:
  Variant::~Variant(&entireTagFilter);
  return bVar1;
}

Assistant:

bool checkAlignmentTag(const PropertyFilterValue& valueFilter, const BamAlignment& al)
    {

        // ensure filter contains string data
        Variant entireTagFilter = valueFilter.Value;
        if (!entireTagFilter.is_type<std::string>()) return false;

        // localize string from variant
        const std::string& entireTagFilterString = entireTagFilter.get<std::string>();

        // ensure we have at least "XX:x"
        if (entireTagFilterString.length() < 4) return false;

        // get tagName & lookup in alignment
        // if found, set tagType to tag type character
        // if not found, return false
        const std::string& tagName = entireTagFilterString.substr(0, 2);
        char tagType = '\0';
        if (!al.GetTagType(tagName, tagType)) return false;

        // remove tagName & ':' from beginning tagFilter
        std::string tagFilterString = entireTagFilterString.substr(3);

        // switch on tag type to set tag query value & parse filter token
        int8_t asciiFilterValue, asciiQueryValue;
        int32_t intFilterValue, intQueryValue;
        uint32_t uintFilterValue, uintQueryValue;
        float realFilterValue, realQueryValue;
        std::string stringFilterValue, stringQueryValue;

        PropertyFilterValue tagFilter;
        PropertyFilterValue::ValueCompareType compareType;
        bool keepAlignment = false;
        switch (tagType) {

            // ASCII tag type
            case 'A':
                if (al.GetTag(tagName, asciiQueryValue)) {
                    if (FilterEngine<BamAlignmentChecker>::parseToken(
                            tagFilterString, asciiFilterValue, compareType)) {
                        tagFilter.Value = asciiFilterValue;
                        tagFilter.Type = compareType;
                        keepAlignment = tagFilter.check(asciiQueryValue);
                    }
                }
                break;

            // signed int tag type
            case 'c':
            case 's':
            case 'i':
                if (al.GetTag(tagName, intQueryValue)) {
                    if (FilterEngine<BamAlignmentChecker>::parseToken(
                            tagFilterString, intFilterValue, compareType)) {
                        tagFilter.Value = intFilterValue;
                        tagFilter.Type = compareType;
                        keepAlignment = tagFilter.check(intQueryValue);
                    }
                }
                break;

            // unsigned int tag type
            case 'C':
            case 'S':
            case 'I':
                if (al.GetTag(tagName, uintQueryValue)) {
                    if (FilterEngine<BamAlignmentChecker>::parseToken(
                            tagFilterString, uintFilterValue, compareType)) {
                        tagFilter.Value = uintFilterValue;
                        tagFilter.Type = compareType;
                        keepAlignment = tagFilter.check(uintQueryValue);
                    }
                }
                break;

            // 'real' tag type
            case 'f':
                if (al.GetTag(tagName, realQueryValue)) {
                    if (FilterEngine<BamAlignmentChecker>::parseToken(
                            tagFilterString, realFilterValue, compareType)) {
                        tagFilter.Value = realFilterValue;
                        tagFilter.Type = compareType;
                        keepAlignment = tagFilter.check(realQueryValue);
                    }
                }
                break;

                // string tag type

            case 'Z':
            case 'H':
                if (al.GetTag(tagName, stringQueryValue)) {
                    if (FilterEngine<BamAlignmentChecker>::parseToken(
                            tagFilterString, stringFilterValue, compareType)) {
                        tagFilter.Value = stringFilterValue;
                        tagFilter.Type = compareType;
                        keepAlignment = tagFilter.check(stringQueryValue);
                    }
                }
                break;

            // unknown tag type
            default:
                keepAlignment = false;
        }

        return keepAlignment;
    }